

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roialign_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::ROIAlign_x86_avx::forward
          (ROIAlign_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ulong uVar3;
  Mat *this_00;
  Mat *this_01;
  _func_int **pp_Var4;
  void *pvVar5;
  int iVar6;
  float *pfVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int _c;
  void *pvVar13;
  long lVar14;
  _func_int *p_Var15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar32;
  float fVar34;
  float fVar35;
  float fVar36;
  undefined1 auVar33 [16];
  undefined1 auVar37 [12];
  undefined1 in_ZMM5 [64];
  void *local_148;
  float local_108;
  vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_> pre_calc;
  undefined1 local_d8 [8];
  float fStack_d0;
  float fStack_cc;
  Mat local_a0;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 auVar31 [64];
  
  auVar37 = in_ZMM5._4_12_;
  this_00 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  iVar12 = this_00->w;
  iVar10 = this_00->h;
  _c = this_00->c;
  this_01 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ncnn::Mat::create(this_01,*(int *)(&this->field_0xd0 + (long)this->_vptr_ROIAlign_x86_avx[-3]),
                    *(int *)(&this->field_0xd4 + (long)this->_vptr_ROIAlign_x86_avx[-3]),_c,
                    this_00->elemsize,opt->blob_allocator);
  iVar21 = -100;
  if ((this_01->data != (void *)0x0) && ((long)this_01->c * this_01->cstep != 0)) {
    p_Var15 = this->_vptr_ROIAlign_x86_avx[-3];
    fVar32 = *(float *)(&this->field_0xd8 + (long)p_Var15);
    uVar1 = *this_00[1].data;
    uVar2 = *(undefined8 *)((long)this_00[1].data + 8);
    local_d8._0_4_ = fVar32 * (float)uVar1;
    local_d8._4_4_ = fVar32 * (float)((ulong)uVar1 >> 0x20);
    fStack_d0 = fVar32 * 0.0;
    fStack_cc = fVar32 * 0.0;
    auVar23._0_4_ = (float)uVar2 * fVar32;
    auVar23._4_4_ = (float)((ulong)uVar2 >> 0x20) * fVar32;
    auVar23._8_4_ = fVar32 * 0.0;
    auVar23._12_4_ = fVar32 * 0.0;
    auVar23 = vsubps_avx(auVar23,_local_d8);
    if ((&this->field_0xe0)[(long)p_Var15] == '\x01') {
      local_d8._4_4_ = (float)local_d8._4_4_ + -0.5;
      local_d8._0_4_ = (float)local_d8._0_4_ + -0.5;
      fStack_d0 = fStack_d0 + -0.5;
      fStack_cc = fStack_cc + -0.5;
    }
    else {
      auVar24._8_4_ = 0x3f800000;
      auVar24._0_8_ = 0x3f8000003f800000;
      auVar24._12_4_ = 0x3f800000;
      auVar23 = vmaxps_avx(auVar23,auVar24);
    }
    uVar3 = *(ulong *)(&this->field_0xd0 + (long)p_Var15);
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar3;
    auVar24 = vcvtdq2ps_avx(auVar29);
    auVar29 = vrcpps_avx(auVar24);
    fVar32 = auVar23._0_4_ * auVar29._0_4_;
    fVar34 = auVar23._4_4_ * auVar29._4_4_;
    fVar35 = auVar23._8_4_ * auVar29._8_4_;
    fVar36 = auVar23._12_4_ * auVar29._12_4_;
    auVar27._0_4_ = auVar24._0_4_ * fVar32;
    auVar27._4_4_ = auVar24._4_4_ * fVar34;
    auVar27._8_4_ = auVar24._8_4_ * fVar35;
    auVar27._12_4_ = auVar24._12_4_ * fVar36;
    auVar23 = vsubps_avx(auVar23,auVar27);
    auVar28._0_4_ = fVar32 + auVar29._0_4_ * auVar23._0_4_;
    auVar28._4_4_ = fVar34 + auVar29._4_4_ * auVar23._4_4_;
    auVar28._8_4_ = fVar35 + auVar29._8_4_ * auVar23._8_4_;
    auVar28._12_4_ = fVar36 + auVar29._12_4_ * auVar23._12_4_;
    iVar21 = (int)(uVar3 >> 0x20);
    fVar32 = local_d8._0_4_;
    if (*(int *)(&this->field_0xe4 + (long)p_Var15) == 1) {
      auVar23 = vmovshdup_avx(auVar28);
      if (*(int *)(&this->field_0xdc + (long)p_Var15) < 1) {
        auVar24 = vroundss_avx(auVar23,auVar23,10);
        fVar34 = auVar24._0_4_;
        auVar24 = vroundss_avx(auVar28,auVar28,10);
        fVar35 = auVar24._0_4_;
      }
      else {
        fVar34 = (float)*(int *)(&this->field_0xdc + (long)p_Var15);
        fVar35 = fVar34;
      }
      iVar6 = (int)fVar34;
      iVar9 = (int)fVar35;
      std::vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::vector
                (&pre_calc,(long)iVar21 * (long)(int)uVar3 * (long)iVar9 * (long)iVar6,
                 (allocator_type *)&local_a0);
      iVar21 = 1;
      if (1 < iVar6 * iVar9) {
        iVar21 = iVar6 * iVar9;
      }
      auVar24 = vmovshdup_avx(_local_d8);
      local_108 = auVar23._0_4_;
      detectron2_pre_calc_for_bilinear_interpolate<float>
                (iVar10,iVar12,*(int *)(&this->field_0xd4 + (long)this->_vptr_ROIAlign_x86_avx[-3]),
                 *(int *)(&this->field_0xd0 + (long)this->_vptr_ROIAlign_x86_avx[-3]),iVar6,iVar9,
                 auVar24._0_4_,fVar32,local_108,auVar28._0_4_,iVar6,iVar9,&pre_calc);
      if (iVar9 < 1) {
        iVar9 = 0;
      }
      if (iVar6 < 1) {
        iVar6 = 0;
      }
      if (_c < 1) {
        _c = 0;
      }
      for (iVar12 = 0; iVar12 != _c; iVar12 = iVar12 + 1) {
        ncnn::Mat::channel(&local_a0,this_00,iVar12);
        pvVar5 = local_a0.data;
        ncnn::Mat::~Mat(&local_a0);
        ncnn::Mat::channel(&local_a0,this_01,iVar12);
        pvVar13 = local_a0.data;
        ncnn::Mat::~Mat(&local_a0);
        pp_Var4 = this->_vptr_ROIAlign_x86_avx;
        p_Var15 = pp_Var4[-3];
        iVar10 = 0;
        for (iVar11 = 0; iVar11 < *(int *)(&this->field_0xd4 + (long)p_Var15); iVar11 = iVar11 + 1)
        {
          for (lVar14 = 0; lVar14 < *(int *)(&this->field_0xd0 + (long)p_Var15); lVar14 = lVar14 + 1
              ) {
            fVar32 = 0.0;
            iVar16 = iVar10;
            for (iVar17 = 0; iVar17 != iVar6; iVar17 = iVar17 + 1) {
              pfVar7 = &pre_calc.
                        super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar16].w1;
              iVar20 = iVar9;
              while (bVar22 = iVar20 != 0, iVar20 = iVar20 + -1, bVar22) {
                auVar23 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar5 +
                                                         (long)((PreCalc<float> *)(pfVar7 + -4))->
                                                               pos1 * 4)),
                                        ZEXT416(*(uint *)((long)pvVar5 + (long)(int)pfVar7[-3] * 4))
                                        ,0x10);
                auVar23 = vinsertps_avx(auVar23,ZEXT416(*(uint *)((long)pvVar5 +
                                                                 (long)(int)pfVar7[-2] * 4)),0x20);
                auVar23 = vinsertps_avx(auVar23,ZEXT416(*(uint *)((long)pvVar5 +
                                                                 (long)(int)pfVar7[-1] * 4)),0x30);
                auVar26._0_4_ = auVar23._0_4_ * *pfVar7;
                auVar26._4_4_ = auVar23._4_4_ * pfVar7[1];
                auVar26._8_4_ = auVar23._8_4_ * pfVar7[2];
                auVar26._12_4_ = auVar23._12_4_ * pfVar7[3];
                auVar23 = vhaddps_avx(auVar26,auVar26);
                auVar23 = vhaddps_avx(auVar23,auVar23);
                fVar32 = fVar32 + auVar23._0_4_;
                pfVar7 = pfVar7 + 8;
              }
              iVar16 = iVar16 + iVar9;
            }
            iVar10 = iVar10 + iVar6 * iVar9;
            *(float *)((long)pvVar13 + lVar14 * 4) = fVar32 * (1.0 / (float)iVar21);
            p_Var15 = pp_Var4[-3];
          }
          pvVar13 = (void *)((long)pvVar13 + (long)*(int *)(&this->field_0xd0 + (long)p_Var15) * 4);
        }
      }
    }
    else {
      if (*(int *)(&this->field_0xe4 + (long)p_Var15) != 0) {
        return 0;
      }
      auVar25._0_4_ = (float)*(int *)(&this->field_0xdc + (long)p_Var15);
      auVar25._4_12_ = auVar37;
      auVar24 = vroundps_avx(auVar28,10);
      auVar23 = vpshufd_avx(ZEXT416((uint)CONCAT71((int7)((ulong)p_Var15 >> 8),
                                                   0 < *(int *)(&this->field_0xdc + (long)p_Var15)))
                            ,0x50);
      auVar29 = vpslld_avx(auVar23,0x1f);
      auVar23 = vmovsldup_avx(auVar25);
      auVar23 = vblendvps_avx(auVar24,auVar23,auVar29);
      std::vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::vector
                (&pre_calc,
                 (long)iVar21 * (long)(int)auVar23._4_4_ *
                 (long)(int)uVar3 * (long)(int)auVar23._0_4_,(allocator_type *)&local_a0);
      p_Var15 = this->_vptr_ROIAlign_x86_avx[-3];
      local_48 = vmovshdup_avx(auVar28);
      local_58 = vmovshdup_avx(_local_d8);
      original_pre_calc_for_bilinear_interpolate<float>
                (iVar10,iVar12,*(int *)(&this->field_0xd4 + (long)p_Var15),
                 *(int *)(&this->field_0xd0 + (long)p_Var15),local_58._0_4_,fVar32,local_48._0_4_,
                 auVar28._0_4_,*(int *)(&this->field_0xdc + (long)p_Var15),&pre_calc);
      iVar21 = 0;
      if (_c < 1) {
        _c = 0;
      }
      for (; iVar21 != _c; iVar21 = iVar21 + 1) {
        ncnn::Mat::channel(&local_a0,this_00,iVar21);
        pvVar13 = local_a0.data;
        ncnn::Mat::~Mat(&local_a0);
        ncnn::Mat::channel(&local_a0,this_01,iVar21);
        local_148 = local_a0.data;
        ncnn::Mat::~Mat(&local_a0);
        pp_Var4 = this->_vptr_ROIAlign_x86_avx;
        p_Var15 = pp_Var4[-3];
        iVar9 = 0;
        iVar6 = 0;
        while (iVar6 < *(int *)(&this->field_0xd4 + (long)p_Var15)) {
          fVar34 = (float)iVar6;
          iVar6 = iVar6 + 1;
          auVar23 = vmaxss_avx(ZEXT416((uint)((float)local_48._0_4_ * fVar34 + (float)local_58._0_4_
                                             )),ZEXT816(0) << 0x20);
          auVar24 = vminss_avx(ZEXT416((uint)(float)iVar10),auVar23);
          auVar23 = vmaxss_avx(ZEXT416((uint)((float)local_48._0_4_ * (float)iVar6 +
                                             (float)local_58._0_4_)),ZEXT816(0) << 0x20);
          auVar23 = vminss_avx(ZEXT416((uint)(float)iVar10),auVar23);
          auVar29 = ZEXT416((uint)(auVar23._0_4_ - auVar24._0_4_));
          auVar29 = vroundss_avx(auVar29,auVar29,10);
          lVar14 = 0;
          while (lVar14 < *(int *)(&this->field_0xd0 + (long)p_Var15)) {
            auVar30._0_12_ = ZEXT812(0);
            auVar30._12_4_ = 0;
            auVar31 = ZEXT1664(auVar30);
            auVar27 = vmaxss_avx(ZEXT416((uint)(auVar28._0_4_ * (float)(int)lVar14 + fVar32)),
                                 auVar30);
            auVar26 = vminss_avx(ZEXT416((uint)(float)iVar12),auVar27);
            auVar27 = vmaxss_avx(ZEXT416((uint)(auVar28._0_4_ * (float)(int)(lVar14 + 1) + fVar32)),
                                 auVar30);
            auVar27 = vminss_avx(ZEXT416((uint)(float)iVar12),auVar27);
            if (*(int *)(&this->field_0xdc + (long)p_Var15) < 1) {
              auVar25 = ZEXT416((uint)(auVar27._0_4_ - auVar26._0_4_));
              auVar25 = vroundss_avx(auVar25,auVar25,10);
              fVar35 = auVar29._0_4_;
              fVar34 = auVar25._0_4_;
            }
            else {
              fVar35 = (float)*(int *)(&this->field_0xdc + (long)p_Var15);
              fVar34 = fVar35;
            }
            iVar16 = (int)fVar35;
            iVar17 = (int)fVar34;
            iVar20 = 0;
            iVar11 = 0;
            if (0 < iVar17) {
              iVar11 = iVar17;
            }
            iVar18 = 0;
            if (0 < iVar16) {
              iVar18 = iVar16;
            }
            iVar8 = iVar9;
            for (; iVar20 != iVar18; iVar20 = iVar20 + 1) {
              pfVar7 = &pre_calc.
                        super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar8].w1;
              iVar19 = iVar11;
              while (bVar22 = iVar19 != 0, iVar19 = iVar19 + -1, bVar22) {
                auVar25 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar13 +
                                                         (long)((PreCalc<float> *)(pfVar7 + -4))->
                                                               pos1 * 4)),
                                        ZEXT416(*(uint *)((long)pvVar13 + (long)(int)pfVar7[-3] * 4)
                                               ),0x10);
                auVar25 = vinsertps_avx(auVar25,ZEXT416(*(uint *)((long)pvVar13 +
                                                                 (long)(int)pfVar7[-2] * 4)),0x20);
                auVar25 = vinsertps_avx(auVar25,ZEXT416(*(uint *)((long)pvVar13 +
                                                                 (long)(int)pfVar7[-1] * 4)),0x30);
                auVar33._0_4_ = auVar25._0_4_ * *pfVar7;
                auVar33._4_4_ = auVar25._4_4_ * pfVar7[1];
                auVar33._8_4_ = auVar25._8_4_ * pfVar7[2];
                auVar33._12_4_ = auVar25._12_4_ * pfVar7[3];
                auVar25 = vhaddps_avx(auVar33,auVar33);
                auVar25 = vhaddps_avx(auVar25,auVar25);
                auVar31 = ZEXT464((uint)(auVar31._0_4_ + auVar25._0_4_));
                pfVar7 = pfVar7 + 8;
              }
              iVar8 = iVar8 + iVar11;
            }
            fVar34 = 0.0;
            if (auVar24._0_4_ < auVar23._0_4_ && auVar26._0_4_ < auVar27._0_4_) {
              fVar34 = auVar31._0_4_ / (float)(iVar17 * iVar16);
            }
            iVar9 = iVar9 + iVar18 * iVar11;
            *(float *)((long)local_148 + lVar14 * 4) = fVar34;
            lVar14 = lVar14 + 1;
            p_Var15 = pp_Var4[-3];
          }
          local_148 = (void *)((long)local_148 +
                              (long)*(int *)(&this->field_0xd0 + (long)p_Var15) * 4);
        }
      }
    }
    std::_Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::~_Vector_base
              (&pre_calc.
                super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>);
    iVar21 = 0;
  }
  return iVar21;
}

Assistant:

int ROIAlign_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const int width = bottom_blob.w;
    const int height = bottom_blob.h;
    const size_t elemsize = bottom_blob.elemsize;
    const int channels = bottom_blob.c;

    const Mat& roi_blob = bottom_blobs[1];

    Mat& top_blob = top_blobs[0];
    top_blob.create(pooled_width, pooled_height, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // For each ROI R = [x y w h]: max pool over R
    const float* roi_ptr = roi_blob;

    float roi_start_w = roi_ptr[0] * spatial_scale;
    float roi_start_h = roi_ptr[1] * spatial_scale;
    float roi_end_w = roi_ptr[2] * spatial_scale;
    float roi_end_h = roi_ptr[3] * spatial_scale;
    if (aligned)
    {
        roi_start_w -= 0.5f;
        roi_start_h -= 0.5f;
        roi_end_w -= 0.5f;
        roi_end_h -= 0.5f;
    }

    float roi_width = roi_end_w - roi_start_w;
    float roi_height = roi_end_h - roi_start_h;

    if (!aligned)
    {
        roi_width = std::max(roi_width, 1.f);
        roi_height = std::max(roi_height, 1.f);
    }

    float bin_size_w = (float)roi_width / (float)pooled_width;
    float bin_size_h = (float)roi_height / (float)pooled_height;

    if (version == 0)
    {
        // original version
        int roi_bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_height / pooled_height));
        int roi_bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_width / pooled_width));
        std::vector<PreCalc<float> > pre_calc(
            (size_t)roi_bin_grid_h * roi_bin_grid_w * pooled_width * pooled_height);
        original_pre_calc_for_bilinear_interpolate(
            height,
            width,
            pooled_height,
            pooled_width,
            roi_start_h,
            roi_start_w,
            bin_size_h,
            bin_size_w,
            sampling_ratio,
            pre_calc);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            int pre_calc_index = 0;

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    // Compute pooling region for this output unit:
                    //  start (included) = ph * roi_height / pooled_height
                    //  end (excluded) = (ph + 1) * roi_height / pooled_height
                    float hstart = roi_start_h + ph * bin_size_h;
                    float wstart = roi_start_w + pw * bin_size_w;
                    float hend = roi_start_h + (ph + 1) * bin_size_h;
                    float wend = roi_start_w + (pw + 1) * bin_size_w;

                    hstart = std::min(std::max(hstart, 0.f), (float)height);
                    wstart = std::min(std::max(wstart, 0.f), (float)width);
                    hend = std::min(std::max(hend, 0.f), (float)height);
                    wend = std::min(std::max(wend, 0.f), (float)width);

                    int bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(hend - hstart));
                    int bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(wend - wstart));

                    bool is_empty = (hend <= hstart) || (wend <= wstart);
                    int area = bin_grid_h * bin_grid_w;

                    float sum = 0.f;
                    for (int by = 0; by < bin_grid_h; by++)
                    {
                        for (int bx = 0; bx < bin_grid_w; bx++)
                        {
                            PreCalc<float>& pc = pre_calc[pre_calc_index++];
                            // bilinear interpolate at (x,y)
                            sum += pc.w1 * ptr[pc.pos1] + pc.w2 * ptr[pc.pos2] + pc.w3 * ptr[pc.pos3] + pc.w4 * ptr[pc.pos4];
                        }
                    }
                    outptr[pw] = is_empty ? 0.f : (sum / (float)area);
                }

                outptr += pooled_width;
            }
        }
    }
    else if (version == 1)
    {
        // the version in detectron 2
        int roi_bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_height / pooled_height));
        int roi_bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_width / pooled_width));

        const float count = (float)std::max(roi_bin_grid_h * roi_bin_grid_w, 1);

        std::vector<PreCalc<float> > pre_calc(
            (size_t)roi_bin_grid_h * roi_bin_grid_w * pooled_width * pooled_height);
        detectron2_pre_calc_for_bilinear_interpolate(
            height,
            width,
            pooled_height,
            pooled_width,
            roi_bin_grid_h,
            roi_bin_grid_w,
            roi_start_h,
            roi_start_w,
            bin_size_h,
            bin_size_w,
            roi_bin_grid_h,
            roi_bin_grid_w,
            pre_calc);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            int pre_calc_index = 0;

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    float output_val = 0.f;
                    for (int iy = 0; iy < roi_bin_grid_h; iy++)
                    {
                        for (int ix = 0; ix < roi_bin_grid_w; ix++)
                        {
                            PreCalc<float>& pc = pre_calc[pre_calc_index++];

                            output_val += pc.w1 * ptr[pc.pos1] + pc.w2 * ptr[pc.pos2] + pc.w3 * ptr[pc.pos3] + pc.w4 * ptr[pc.pos4];
                        }
                    }
                    output_val /= count;
                    outptr[pw] = output_val;
                }
                outptr += pooled_width;
            }
        }
    }

    return 0;
}